

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

int adiak_cmdline(void)

{
  int local_38;
  uint local_34;
  int retval;
  int myargc;
  char **myargv;
  int local_20;
  int j;
  int i;
  int arglist_size;
  char *arglist;
  int result;
  
  _i = (char *)0x0;
  _retval = (long *)0x0;
  local_34 = 0;
  local_38 = -1;
  arglist._4_4_ = adksys_get_cmdline_buffer((char **)&i,&j);
  if (arglist._4_4_ == -1) {
    arglist._4_4_ = -1;
  }
  else {
    for (local_20 = 0; local_20 < j; local_20 = local_20 + 1) {
      if (_i[local_20] == '\0') {
        local_34 = local_34 + 1;
      }
    }
    _retval = (long *)malloc((long)(int)(local_34 + 1) << 3);
    myargv._4_4_ = 1;
    *_retval = (long)_i;
    for (local_20 = 0; local_20 < j; local_20 = local_20 + 1) {
      if (_i[local_20] == '\0') {
        _retval[myargv._4_4_] = (long)(_i + (long)local_20 + 1);
        myargv._4_4_ = myargv._4_4_ + 1;
      }
    }
    arglist._4_4_ = adiak_namevalue("cmdline",2,"runinfo","[%s]",_retval,(ulong)local_34);
    if (arglist._4_4_ != -1) {
      local_38 = 0;
    }
  }
  if (_i != (char *)0x0) {
    free(_i);
  }
  if (_retval != (long *)0x0) {
    free(_retval);
  }
  return local_38;
}

Assistant:

int adiak_cmdline()
{
   int result;
   char *arglist = NULL;
   int  arglist_size, i, j = 0;
   char **myargv = NULL;
   int myargc = 0;
   int retval = -1;

   result = adksys_get_cmdline_buffer(&arglist, &arglist_size);
   if (result == -1)
      goto error;

   for (i = 0; i < arglist_size; i++) {
      if (arglist[i] == '\0')
         myargc++;
   }

   myargv = (char **) malloc(sizeof(char *) * (myargc+1));
   myargv[j++] = arglist;
   for (i = 0; i < arglist_size; i++) {
      if (arglist[i] == '\0')
         myargv[j++] = arglist + i + 1;
   }

   result = adiak_namevalue("cmdline", adiak_general, "runinfo", "[%s]", myargv, myargc);
   if (result == -1)
      goto error;

   retval = 0;
  error:
   if (arglist)
      free(arglist);
   if (myargv)
      free(myargv);
   return retval;
}